

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsVersion.cpp
# Opt level: O0

string * getCPUModel_abi_cxx11_(void)

{
  byte bVar1;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  size_type sVar3;
  reference pvVar4;
  string *in_RDI;
  size_type eline;
  size_type cloc;
  size_type modelLoc;
  string line;
  string info;
  ifstream cpufile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *modelString;
  undefined7 in_stack_fffffffffffffd60;
  string *this;
  undefined6 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  string local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  long local_210 [66];
  
  this = in_RDI;
  std::ifstream::ifstream(local_210,"/proc/cpuinfo",_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_210 + *(long *)(local_210[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    do {
      __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_210,local_260);
      uVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&(__str->_M_dataplus)._M_p +
                                *(long *)((__str->_M_dataplus)._M_p + -0x18)));
      if (!(bool)uVar2) goto LAB_00686622;
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffd87,
                                  CONCAT16(bVar1,in_stack_fffffffffffffd80)),(char *)this,
                         (size_type)in_RDI);
    } while (sVar3 == 0xffffffffffffffff);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__str);
LAB_00686622:
    std::ifstream::close();
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd87,CONCAT16(bVar1,in_stack_fffffffffffffd80))
                       ,(char *)this,(size_type)in_RDI);
    if (sVar3 == 0xffffffffffffffff) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(uVar2,in_stack_fffffffffffffd60),(char)((ulong)local_240 >> 0x38),
                    0x68666f);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_stack_fffffffffffffd87,CONCAT16(bVar1,in_stack_fffffffffffffd80)),
                    (char *)this,(size_type)in_RDI);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (size_type)in_RDI,(size_type)__str);
      pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(uVar2,in_stack_fffffffffffffd60));
      if (*pvVar4 == '\0') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar2,in_stack_fffffffffffffd60));
      }
    }
    local_220 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffffd60));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffffd60));
  }
  else {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    local_220 = 1;
  }
  std::ifstream::~ifstream(local_210);
  return this;
}

Assistant:

inline std::string getCPUModel()
{  // Get the cpu from /proc/cpuinfo
    std::ifstream cpufile("/proc/cpuinfo");
    if (!cpufile) {
        return std::string{};
    }
    std::string info;
    std::string line;
    while (getline(cpufile, line)) {
        if (line.find("model name") != std::string::npos) {
            info.append(line);
            break;
        }
    }
    cpufile.close();
    auto modelLoc = info.find("model name");

    if (modelLoc != std::string::npos) {
        auto cloc = info.find_first_of(':', modelLoc);
        auto eline = info.find_first_of("\n\r\0", modelLoc);
        auto modelString = info.substr(cloc + 1, eline - cloc - 1);
        if (modelString.back() == '\0') {
            modelString.pop_back();
        }
        return modelString;
    }
    return std::string{};
}